

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::setHeader(QTreeView *this,QHeaderView *header)

{
  QAbstractItemViewPrivate *this_00;
  QHeaderView *pQVar1;
  long *plVar2;
  Data *pDVar3;
  bool bVar4;
  QAbstractItemModel *pQVar5;
  QObject *pQVar6;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = *(QHeaderView **)
            &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
             field_0x50;
  if (header != (QHeaderView *)0x0 && pQVar1 != header) {
    if ((pQVar1 != (QHeaderView *)0x0) &&
       (*(QTreeView **)
         (*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8 + 0x10) == this)) {
      (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.
                             super_QFrame.super_QWidget + 0x20))();
    }
    *(QHeaderView **)
     &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
      field_0x50 = header;
    QWidget::setParent((QWidget *)header,(QWidget *)this);
    QHeaderView::setFirstSectionMovable
              (*(QHeaderView **)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,false);
    pQVar5 = QAbstractItemView::model
                       (*(QAbstractItemView **)
                         &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                          super_QWidgetPrivate.field_0x50);
    if (pQVar5 == (QAbstractItemModel *)0x0) {
      plVar2 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                          super_QWidgetPrivate.field_0x50;
      (**(code **)(*plVar2 + 0x1c8))(plVar2,this_00->model);
      bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_00->selectionModel);
      if (bVar4) {
        plVar2 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x50;
        pDVar3 = (this_00->selectionModel).wp.d;
        if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
          pQVar6 = (QObject *)0x0;
        }
        else {
          pQVar6 = (this_00->selectionModel).wp.value;
        }
        (**(code **)(*plVar2 + 0x1d0))(plVar2,pQVar6);
      }
    }
    type = (ConnectionType)this;
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTreeView::*)(int,int,int)>
              ((Object *)local_48,
               *(offset_in_QHeaderView_to_subr *)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,(ContextType *)QHeaderView::sectionResized,
               (offset_in_QTreeView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(int,int,int),void(QTreeView::*)()>
              ((Object *)(local_48 + 8),
               *(offset_in_QHeaderView_to_subr *)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,(ContextType *)QHeaderView::sectionMoved,
               (offset_in_QTreeView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(int,int),void(QTreeView::*)(int,int)>
              ((Object *)(local_48 + 0x10),
               *(offset_in_QHeaderView_to_subr *)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,(ContextType *)QHeaderView::sectionCountChanged,
               (offset_in_QTreeView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(int),void(QTreeView::*)(int)>
              ((Object *)(local_48 + 0x18),
               *(offset_in_QHeaderView_to_subr *)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,
               (ContextType *)QHeaderView::sectionHandleDoubleClicked,
               (offset_in_QTreeView_to_subr *)0x0,type);
    QObject::connect<void(QHeaderView::*)(),void(QTreeView::*)()>
              ((Object *)(local_48 + 0x20),
               *(offset_in_QHeaderView_to_subr *)
                &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50,(ContextType *)QHeaderView::geometriesChanged,
               (offset_in_QTreeView_to_subr *)0x0,type);
    std::array<QMetaObject::Connection,_5UL>::operator=
              ((array<QMetaObject::Connection,_5UL> *)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .statusTip.d.ptr,(array<QMetaObject::Connection,_5UL> *)local_48);
    std::array<QMetaObject::Connection,_5UL>::~array
              ((array<QMetaObject::Connection,_5UL> *)local_48);
    setSortingEnabled(this,*(bool *)((long)&this_00[1].super_QAbstractScrollAreaPrivate.
                                            super_QFramePrivate.super_QWidgetPrivate.focus_next + 3)
                     );
    QAbstractItemViewPrivate::updateGeometry(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setHeader(QHeaderView *header)
{
    Q_D(QTreeView);
    if (header == d->header || !header)
        return;
    if (d->header && d->header->parent() == this)
        delete d->header;
    d->header = header;
    d->header->setParent(this);
    d->header->setFirstSectionMovable(false);

    if (!d->header->model()) {
        d->header->setModel(d->model);
        if (d->selectionModel)
            d->header->setSelectionModel(d->selectionModel);
    }

    d->headerConnections = {
        connect(d->header, &QHeaderView::sectionResized,
                this, &QTreeView::columnResized),
        connect(d->header, &QHeaderView::sectionMoved,
                this, &QTreeView::columnMoved),
        connect(d->header, &QHeaderView::sectionCountChanged,
                this, &QTreeView::columnCountChanged),
        connect(d->header, &QHeaderView::sectionHandleDoubleClicked,
                this, &QTreeView::resizeColumnToContents),
        connect(d->header, &QHeaderView::geometriesChanged,
                this, &QTreeView::updateGeometries)
    };

    setSortingEnabled(d->sortingEnabled);
    d->updateGeometry();
}